

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

DH * DSA_dup_DH(DSA *r)

{
  bool bVar1;
  uint uVar2;
  DH *__p;
  pointer pdVar3;
  BIGNUM *pBVar4;
  unique_ptr<dh_st,_bssl::internal::Deleter> local_20;
  UniquePtr<DH> ret;
  DSA *dsa_local;
  
  if (r == (DSA *)0x0) {
    return (DH *)0x0;
  }
  ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dh_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)r;
  __p = DH_new();
  std::unique_ptr<dh_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dh_st,bssl::internal::Deleter> *)&local_20,(pointer)__p);
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (bVar1) {
    dsa_local = (DSA *)0x0;
    goto LAB_002564c1;
  }
  if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 8) != 0) {
    uVar2 = BN_num_bits(*(BIGNUM **)
                         ((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 8));
    pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
    pdVar3->priv_length = uVar2;
    pBVar4 = BN_dup(*(BIGNUM **)
                     ((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 8));
    pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
    pdVar3->q = (BIGNUM *)pBVar4;
    if (pBVar4 == (BIGNUM *)0x0) {
      dsa_local = (DSA *)0x0;
      goto LAB_002564c1;
    }
  }
  if (*(long *)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_dh_st_*,_false>._M_head_impl == 0) {
LAB_002563fa:
    if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x10) != 0) {
      pBVar4 = BN_dup(*(BIGNUM **)
                       ((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x10));
      pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
      pdVar3->g = (BIGNUM *)pBVar4;
      if (pBVar4 == (BIGNUM *)0x0) goto LAB_0025649c;
    }
    if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x18) != 0) {
      pBVar4 = BN_dup(*(BIGNUM **)
                       ((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x18));
      pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
      pdVar3->pub_key = (BIGNUM *)pBVar4;
      if (pBVar4 == (BIGNUM *)0x0) goto LAB_0025649c;
    }
    if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x20) != 0) {
      pBVar4 = BN_dup(*(BIGNUM **)
                       ((long)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dh_st_*,_false>._M_head_impl + 0x20));
      pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
      pdVar3->priv_key = (BIGNUM *)pBVar4;
      if (pBVar4 == (BIGNUM *)0x0) goto LAB_0025649c;
    }
    dsa_local = (DSA *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::release(&local_20);
  }
  else {
    pBVar4 = BN_dup(*(BIGNUM **)
                     ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
    pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
    pdVar3->p = (BIGNUM *)pBVar4;
    if (pBVar4 != (BIGNUM *)0x0) goto LAB_002563fa;
LAB_0025649c:
    dsa_local = (DSA *)0x0;
  }
LAB_002564c1:
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (DH *)dsa_local;
}

Assistant:

DH *DSA_dup_DH(const DSA *dsa) {
  if (dsa == nullptr) {
    return nullptr;
  }

  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }
  if (dsa->q != nullptr) {
    ret->priv_length = BN_num_bits(dsa->q);
    if ((ret->q = BN_dup(dsa->q)) == nullptr) {
      return nullptr;
    }
  }
  if ((dsa->p != nullptr && (ret->p = BN_dup(dsa->p)) == nullptr) ||
      (dsa->g != nullptr && (ret->g = BN_dup(dsa->g)) == nullptr) ||
      (dsa->pub_key != nullptr &&
       (ret->pub_key = BN_dup(dsa->pub_key)) == nullptr) ||
      (dsa->priv_key != nullptr &&
       (ret->priv_key = BN_dup(dsa->priv_key)) == nullptr)) {
    return nullptr;
  }

  return ret.release();
}